

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O1

void __thiscall
mp::BucketAccum1Type<mp::QuadTerms>::~BucketAccum1Type(BucketAccum1Type<mp::QuadTerms> *this)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0x5000;
  do {
    uVar1 = *(ulong *)((long)(this->buckets_)._M_elems[0].folded_.
                             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                             .m_data.m_storage.m_data + lVar2 + 0xffffffffffffffc0U);
    if (6 < uVar1) {
      operator_delete(*(void **)((long)(this->buckets_)._M_elems[0].folded_.
                                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                       .m_data.m_storage.m_data + lVar2 + 0xffffffffffffffb8U),
                      uVar1 << 2);
    }
    uVar1 = *(ulong *)((long)(this->buckets_)._M_elems[0].folded_.
                             super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                             .m_data.m_storage.m_data + lVar2 + 0xffffffffffffff90U);
    if (6 < uVar1) {
      operator_delete(*(void **)((long)(this->buckets_)._M_elems[0].folded_.
                                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                                       .m_data.m_storage.m_data + lVar2 + 0xffffffffffffff88U),
                      uVar1 << 2);
    }
    uVar1 = *(ulong *)((long)this + lVar2 + -0xa0);
    if (6 < uVar1) {
      operator_delete(*(void **)((long)this + lVar2 + -0xa8),uVar1 << 3);
    }
    uVar1 = *(ulong *)((long)this + lVar2 + -0x138);
    if (8 < uVar1) {
      operator_delete(*(void **)((long)this + lVar2 + -0x140),uVar1 << 4);
    }
    lVar2 = lVar2 + -0x140;
  } while (lVar2 != 0);
  return;
}

Assistant:

BucketAccum1Type<Body>::~BucketAccum1Type() {
#ifndef NDEBUG
  for (const auto& b: buckets_)
    assert(b.empty());
#endif
}